

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerMSL::get_or_allocate_builtin_input_member_location
          (CompilerMSL *this,BuiltIn builtin,uint32_t type_id,uint32_t index,uint32_t *comp)

{
  uint uVar1;
  BuiltIn BVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRType *pSVar5;
  const_iterator cVar6;
  BuiltIn *pBVar7;
  uint uVar8;
  BuiltIn argument;
  BuiltIn local_4c;
  TypeID local_48;
  uint32_t local_44;
  SPIRType *local_40;
  ulong local_38;
  
  uVar4 = get_member_location(this,type_id,index,comp);
  if (uVar4 != 0xffffffff) {
    return uVar4;
  }
  if (comp != (uint32_t *)0x0) {
    *comp = 0xffffffff;
  }
  local_48.id = type_id;
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + type_id);
  local_44 = index;
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (pSVar5->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].id);
  uVar4 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar5);
  if (uVar4 != 0) {
    argument = BuiltInPosition;
    local_40 = pSVar5;
    local_38 = (ulong)builtin;
    do {
      local_4c = argument;
      cVar6 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->location_inputs_in_use)._M_h,&local_4c);
      if (cVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        uVar1 = 1;
        do {
          uVar8 = uVar1;
          if (uVar4 == uVar8) break;
          local_4c = argument + uVar8;
          cVar6 = ::std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&(this->location_inputs_in_use)._M_h,&local_4c);
          uVar1 = uVar8 + 1;
        } while (cVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0);
        if (uVar4 <= uVar8) goto LAB_002dc626;
      }
      argument = argument + BuiltInPointSize;
    } while( true );
  }
  argument = BuiltInPosition;
LAB_002dc635:
  Compiler::set_member_decoration((Compiler *)this,local_48,local_44,DecorationLocation,argument);
  BVar2 = builtin;
  if (((this->msl_options).raw_buffer_tese_input == false) &&
     (bVar3 = Compiler::is_tessellating_triangles((Compiler *)this), BVar2 = builtin,
     builtin - BuiltInTessLevelOuter < 2 && bVar3)) {
    local_4c = BuiltInTessLevelInner;
    pBVar7 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->builtin_to_automatic_input_location,&local_4c);
    *pBVar7 = argument;
    local_4c = BuiltInTessLevelOuter;
    BVar2 = local_4c;
  }
  local_4c = BVar2;
  pBVar7 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->builtin_to_automatic_input_location,&local_4c);
  *pBVar7 = argument;
  mark_location_as_used_by_shader(this,argument,pSVar5,StorageClassInput,true);
  return argument;
LAB_002dc626:
  builtin = (BuiltIn)local_38;
  pSVar5 = local_40;
  goto LAB_002dc635;
}

Assistant:

uint32_t CompilerMSL::get_or_allocate_builtin_input_member_location(spv::BuiltIn builtin,
                                                                    uint32_t type_id, uint32_t index,
                                                                    uint32_t *comp)
{
	uint32_t loc = get_member_location(type_id, index, comp);
	if (loc != k_unknown_location)
		return loc;

	if (comp)
		*comp = k_unknown_component;

	// Late allocation. Find a location which is unused by the application.
	// This can happen for built-in inputs in tessellation which are mixed and matched with user inputs.
	auto &mbr_type = get<SPIRType>(get<SPIRType>(type_id).member_types[index]);
	uint32_t count = type_to_location_count(mbr_type);

	loc = 0;

	const auto location_range_in_use = [this](uint32_t location, uint32_t location_count) -> bool {
		for (uint32_t i = 0; i < location_count; i++)
			if (location_inputs_in_use.count(location + i) != 0)
				return true;
		return false;
	};

	while (location_range_in_use(loc, count))
		loc++;

	set_member_decoration(type_id, index, DecorationLocation, loc);

	// Triangle tess level inputs are shared in one packed float4,
	// mark both builtins as sharing one location.
	if (!msl_options.raw_buffer_tese_input && is_tessellating_triangles() &&
	    (builtin == BuiltInTessLevelInner || builtin == BuiltInTessLevelOuter))
	{
		builtin_to_automatic_input_location[BuiltInTessLevelInner] = loc;
		builtin_to_automatic_input_location[BuiltInTessLevelOuter] = loc;
	}
	else
		builtin_to_automatic_input_location[builtin] = loc;

	mark_location_as_used_by_shader(loc, mbr_type, StorageClassInput, true);
	return loc;
}